

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ArgumentMismatch::ArgumentMismatch
          (ArgumentMismatch *this,string *ArgumentMismatch,string *msg,ExitCodes exit_code)

{
  string local_68;
  string local_48;
  ExitCodes local_24;
  string *psStack_20;
  ExitCodes exit_code_local;
  string *msg_local;
  string *ArgumentMismatch_local;
  ArgumentMismatch *this_local;
  
  local_24 = exit_code;
  psStack_20 = msg;
  msg_local = ArgumentMismatch;
  ArgumentMismatch_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)ArgumentMismatch);
  ::std::__cxx11::string::string((string *)&local_68,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,&local_68,local_24);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__ArgumentMismatch_00218ce8;
  return;
}

Assistant:

ArgumentMismatch(std::string name, int expected, size_t recieved)
        : ArgumentMismatch(expected > 0 ? ("Expected exactly " + std::to_string(expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved))
                                        : ("Expected at least " + std::to_string(-expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved)),
                           ExitCodes::ArgumentMismatch) {}